

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<unsigned_int>
               (string *text,vector<unsigned_int,_std::allocator<unsigned_int>_> *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  bool local_1da;
  uint32_t local_1d0 [2];
  uint v;
  undefined1 local_1c0 [8];
  string token;
  stringstream in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *value_local;
  string *text_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(token.field_2._M_local_buf + 8),(string *)text,_Var2);
  std::__cxx11::string::string((string *)local_1c0);
  while( true ) {
    bVar1 = std::ios::eof();
    local_1da = false;
    if ((bVar1 & 1) == 0) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(token.field_2._M_local_buf + 8),(string *)local_1c0,',');
      local_1da = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    }
    if (local_1da == false) break;
    parse_value((string *)local_1c0,local_1d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (value,local_1d0);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }